

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedStorage.hpp
# Opt level: O2

void __thiscall
supermap::
OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
::appendCopy(OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
             *this,KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *elem)

{
  unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>_>
  uStack_18;
  
  std::
  make_unique<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>>
            ((KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *)&uStack_18);
  (**this->_vptr_OrderedStorage)(this,&uStack_18);
  std::
  unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>_>
  ::~unique_ptr(&uStack_18);
  return;
}

Assistant:

void appendCopy(T elem) {
        append(std::make_unique<T>(std::move(elem)));
    }